

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

JsValueRef
WScriptJsrt::RegisterModuleSourceCallback
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  JsErrorCode JVar1;
  undefined1 local_88 [8];
  AutoString data;
  AutoString fileName;
  JsValueRef pvStack_40;
  JsErrorCode errorCode;
  JsValueRef returnValue;
  void *pvStack_30;
  HRESULT hr;
  void *callbackState_local;
  JsValueRef *ppvStack_20;
  unsigned_short argumentCount_local;
  JsValueRef *arguments_local;
  JsValueRef pvStack_10;
  bool isConstructCall_local;
  JsValueRef callee_local;
  
  returnValue._4_4_ = 0x80004005;
  pvStack_40 = (JsValueRef)0x0;
  pvStack_30 = callbackState;
  callbackState_local._6_2_ = argumentCount;
  ppvStack_20 = arguments;
  arguments_local._7_1_ = isConstructCall;
  pvStack_10 = callee;
  if (argumentCount < 3) {
    ChakraRTInterface::JsGetUndefinedValue(&stack0xffffffffffffffc0);
  }
  else {
    AutoString::AutoString((AutoString *)&data.errorCode);
    AutoString::AutoString((AutoString *)local_88);
    JVar1 = AutoString::Initialize((AutoString *)&data.errorCode,ppvStack_20[1]);
    if (JVar1 == JsNoError) {
      JVar1 = AutoString::Initialize((AutoString *)local_88,ppvStack_20[2]);
      if (JVar1 == JsNoError) {
        SourceMap::Add((AutoString *)&data.errorCode,(AutoString *)local_88);
      }
      else {
        returnValue._4_4_ = 0x80004005;
      }
    }
    else {
      returnValue._4_4_ = 0x80004005;
    }
    AutoString::~AutoString((AutoString *)local_88);
    AutoString::~AutoString((AutoString *)&data.errorCode);
  }
  return pvStack_40;
}

Assistant:

JsValueRef __stdcall WScriptJsrt::RegisterModuleSourceCallback(JsValueRef callee, bool isConstructCall,
    JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    HRESULT hr = E_FAIL;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    JsErrorCode errorCode = JsNoError;

    if (argumentCount < 3)
    {
        IfJsrtErrorSetGo(ChakraRTInterface::JsGetUndefinedValue(&returnValue));
    }
    else
    {
        AutoString fileName;
        AutoString data;
        IfJsrtErrorSetGo(fileName.Initialize(arguments[1]));
        IfJsrtErrorSetGo(data.Initialize(arguments[2]));

        SourceMap::Add(fileName, data);
    }

Error:
    return returnValue;
}